

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

bool __thiscall
btQuantizedBvh::serialize
          (btQuantizedBvh *this,void *o_alignedDataBuffer,uint param_2,bool i_swapEndian)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  bool bVar4;
  ushort uVar5;
  btTraversalMode bVar6;
  uint uVar7;
  btQuantizedBvhNode *pbVar8;
  btBvhSubtreeInfo *pbVar9;
  undefined8 uVar10;
  int i;
  uint uVar11;
  long lVar12;
  undefined7 in_register_00000009;
  btOptimizedBvhNode *pbVar13;
  ulong uVar14;
  long lVar15;
  long *plVar16;
  void *pvVar17;
  long lVar18;
  char *pcVar19;
  undefined4 *puVar20;
  ulong uVar21;
  undefined4 *puVar22;
  long lVar23;
  
  this->m_subtreeHeaderCount = (this->m_SubtreeHeaders).m_size;
  btQuantizedBvh((btQuantizedBvh *)o_alignedDataBuffer);
  uVar11 = this->m_curNodeIndex;
  if ((int)CONCAT71(in_register_00000009,i_swapEndian) == 0) {
    *(uint *)((long)o_alignedDataBuffer + 0x3c) = uVar11;
    uVar10 = *(undefined8 *)((this->m_bvhAabbMin).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 8) = *(undefined8 *)(this->m_bvhAabbMin).m_floats;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x10) = uVar10;
    uVar10 = *(undefined8 *)((this->m_bvhAabbMax).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 0x18) = *(undefined8 *)(this->m_bvhAabbMax).m_floats
    ;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x20) = uVar10;
    uVar10 = *(undefined8 *)((this->m_bvhQuantization).m_floats + 2);
    *(undefined8 *)((long)o_alignedDataBuffer + 0x28) =
         *(undefined8 *)(this->m_bvhQuantization).m_floats;
    *(undefined8 *)((long)o_alignedDataBuffer + 0x30) = uVar10;
    *(btTraversalMode *)((long)o_alignedDataBuffer + 200) = this->m_traversalMode;
    uVar11 = this->m_subtreeHeaderCount;
  }
  else {
    *(uint *)((long)o_alignedDataBuffer + 0x3c) =
         uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
    lVar12 = 0;
    do {
      *(undefined1 *)((long)o_alignedDataBuffer + lVar12 * 4 + 8) =
           *(undefined1 *)((long)(this->m_bvhAabbMin).m_floats + lVar12 * 4 + 3);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar12 * 4 + 9) =
           *(undefined1 *)((long)(this->m_bvhAabbMin).m_floats + lVar12 * 4 + 2);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar12 * 4 + 10) =
           *(undefined1 *)((long)(this->m_bvhAabbMin).m_floats + lVar12 * 4 + 1);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar12 * 4 + 0xb) =
           *(undefined1 *)((this->m_bvhAabbMin).m_floats + lVar12);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    lVar12 = 0;
    do {
      *(undefined1 *)((long)o_alignedDataBuffer + lVar12 * 4 + 0x18) =
           *(undefined1 *)((long)(this->m_bvhAabbMax).m_floats + lVar12 * 4 + 3);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar12 * 4 + 0x19) =
           *(undefined1 *)((long)(this->m_bvhAabbMax).m_floats + lVar12 * 4 + 2);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar12 * 4 + 0x1a) =
           *(undefined1 *)((long)(this->m_bvhAabbMax).m_floats + lVar12 * 4 + 1);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar12 * 4 + 0x1b) =
           *(undefined1 *)((this->m_bvhAabbMax).m_floats + lVar12);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    lVar12 = 0;
    do {
      *(undefined1 *)((long)o_alignedDataBuffer + lVar12 * 4 + 0x28) =
           *(undefined1 *)((long)(this->m_bvhQuantization).m_floats + lVar12 * 4 + 3);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar12 * 4 + 0x29) =
           *(undefined1 *)((long)(this->m_bvhQuantization).m_floats + lVar12 * 4 + 2);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar12 * 4 + 0x2a) =
           *(undefined1 *)((long)(this->m_bvhQuantization).m_floats + lVar12 * 4 + 1);
      *(undefined1 *)((long)o_alignedDataBuffer + lVar12 * 4 + 0x2b) =
           *(undefined1 *)((this->m_bvhQuantization).m_floats + lVar12);
      lVar12 = lVar12 + 1;
    } while (lVar12 != 4);
    bVar6 = this->m_traversalMode;
    *(btTraversalMode *)((long)o_alignedDataBuffer + 200) =
         bVar6 >> 0x18 | (bVar6 & 0xff0000) >> 8 | (bVar6 & 0xff00) << 8 | bVar6 << 0x18;
    uVar11 = this->m_subtreeHeaderCount;
    uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  }
  *(uint *)((long)o_alignedDataBuffer + 0xf0) = uVar11;
  bVar4 = this->m_useQuantization;
  *(bool *)((long)o_alignedDataBuffer + 0x40) = bVar4;
  pvVar1 = (void *)((long)o_alignedDataBuffer + 0xf8);
  uVar11 = this->m_curNodeIndex;
  uVar21 = (ulong)uVar11;
  if (bVar4 == true) {
    if ((*(void **)((long)o_alignedDataBuffer + 0xb8) != (void *)0x0) &&
       (*(char *)((long)o_alignedDataBuffer + 0xc0) == '\x01')) {
      btAlignedFreeInternal(*(void **)((long)o_alignedDataBuffer + 0xb8));
    }
    *(void **)((long)o_alignedDataBuffer + 0xb8) = pvVar1;
    if (i_swapEndian) {
      if (0 < (int)uVar11) {
        pbVar8 = (this->m_quantizedContiguousNodes).m_data;
        lVar12 = 0;
        do {
          uVar5 = *(ushort *)((long)pbVar8->m_quantizedAabbMin + lVar12);
          *(ushort *)((long)o_alignedDataBuffer + lVar12 + 0xf8) = uVar5 << 8 | uVar5 >> 8;
          uVar5 = *(ushort *)((long)pbVar8->m_quantizedAabbMin + lVar12 + 2);
          *(ushort *)((long)o_alignedDataBuffer + lVar12 + 0xfa) = uVar5 << 8 | uVar5 >> 8;
          uVar5 = *(ushort *)((long)pbVar8->m_quantizedAabbMin + lVar12 + 4);
          *(ushort *)((long)o_alignedDataBuffer + lVar12 + 0xfc) = uVar5 << 8 | uVar5 >> 8;
          uVar5 = *(ushort *)((long)pbVar8->m_quantizedAabbMax + lVar12);
          *(ushort *)((long)o_alignedDataBuffer + lVar12 + 0xfe) = uVar5 << 8 | uVar5 >> 8;
          uVar5 = *(ushort *)((long)pbVar8->m_quantizedAabbMax + lVar12 + 2);
          *(ushort *)((long)o_alignedDataBuffer + lVar12 + 0x100) = uVar5 << 8 | uVar5 >> 8;
          uVar5 = *(ushort *)((long)pbVar8->m_quantizedAabbMax + lVar12 + 4);
          *(ushort *)((long)o_alignedDataBuffer + lVar12 + 0x102) = uVar5 << 8 | uVar5 >> 8;
          uVar7 = *(uint *)((long)pbVar8->m_quantizedAabbMax + lVar12 + 6);
          *(uint *)((long)o_alignedDataBuffer + lVar12 + 0x104) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          lVar12 = lVar12 + 0x10;
        } while (uVar21 << 4 != lVar12);
      }
    }
    else if (0 < (int)uVar11) {
      pbVar8 = (this->m_quantizedContiguousNodes).m_data;
      lVar12 = 0;
      do {
        *(undefined2 *)((long)o_alignedDataBuffer + lVar12 + 0xf8) =
             *(undefined2 *)((long)pbVar8->m_quantizedAabbMin + lVar12);
        *(undefined2 *)((long)o_alignedDataBuffer + lVar12 + 0xfa) =
             *(undefined2 *)((long)pbVar8->m_quantizedAabbMin + lVar12 + 2);
        *(undefined2 *)((long)o_alignedDataBuffer + lVar12 + 0xfc) =
             *(undefined2 *)((long)pbVar8->m_quantizedAabbMin + lVar12 + 4);
        *(undefined2 *)((long)o_alignedDataBuffer + lVar12 + 0xfe) =
             *(undefined2 *)((long)pbVar8->m_quantizedAabbMax + lVar12);
        *(undefined2 *)((long)o_alignedDataBuffer + lVar12 + 0x100) =
             *(undefined2 *)((long)pbVar8->m_quantizedAabbMax + lVar12 + 2);
        *(undefined2 *)((long)o_alignedDataBuffer + lVar12 + 0x102) =
             *(undefined2 *)((long)pbVar8->m_quantizedAabbMax + lVar12 + 4);
        *(undefined4 *)((long)o_alignedDataBuffer + lVar12 + 0x104) =
             *(undefined4 *)((long)pbVar8->m_quantizedAabbMax + lVar12 + 6);
        lVar12 = lVar12 + 0x10;
      } while (uVar21 << 4 != lVar12);
    }
    plVar16 = (long *)((long)o_alignedDataBuffer + 0xb8);
    puVar22 = (undefined4 *)((long)o_alignedDataBuffer + 0xac);
    pcVar19 = (char *)((long)o_alignedDataBuffer + 0xc0);
    puVar20 = (undefined4 *)((long)o_alignedDataBuffer + 0xb0);
    lVar12 = (long)(int)uVar11 << 4;
  }
  else {
    if ((*(void **)((long)o_alignedDataBuffer + 0x78) != (void *)0x0) &&
       (*(char *)((long)o_alignedDataBuffer + 0x80) == '\x01')) {
      btAlignedFreeInternal(*(void **)((long)o_alignedDataBuffer + 0x78));
    }
    plVar16 = (long *)((long)o_alignedDataBuffer + 0x78);
    pcVar19 = (char *)((long)o_alignedDataBuffer + 0x80);
    *(undefined1 *)((long)o_alignedDataBuffer + 0x80) = 0;
    *(void **)((long)o_alignedDataBuffer + 0x78) = pvVar1;
    *(uint *)((long)o_alignedDataBuffer + 0x6c) = uVar11;
    *(uint *)((long)o_alignedDataBuffer + 0x70) = uVar11;
    pvVar17 = pvVar1;
    if (i_swapEndian) {
      if (0 < (int)uVar11) {
        pbVar13 = (this->m_contiguousNodes).m_data;
        lVar12 = 3;
        lVar23 = 0x13;
        uVar14 = 0;
        do {
          lVar15 = 0;
          do {
            *(undefined1 *)((long)pvVar17 + lVar15 * 4 + lVar12 + -3) =
                 *(undefined1 *)((long)(pbVar13->m_aabbMinOrg).m_floats + lVar15 * 4 + lVar12);
            *(undefined1 *)((long)pvVar17 + lVar15 * 4 + lVar12 + -2) =
                 *(undefined1 *)((long)(pbVar13->m_aabbMinOrg).m_floats + lVar15 * 4 + lVar12 + -1);
            *(undefined1 *)((long)pvVar17 + lVar15 * 4 + lVar12 + -1) =
                 *(undefined1 *)((long)(pbVar13->m_aabbMinOrg).m_floats + lVar15 * 4 + lVar12 + -2);
            *(undefined1 *)((long)pvVar17 + lVar15 * 4 + lVar12) =
                 *(undefined1 *)((long)(pbVar13->m_aabbMinOrg).m_floats + lVar15 * 4 + lVar12 + -3);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 4);
          lVar15 = *plVar16 + lVar23;
          pbVar13 = (this->m_contiguousNodes).m_data;
          lVar18 = 0;
          do {
            *(undefined1 *)(lVar15 + -3 + lVar18 * 4) =
                 *(undefined1 *)((long)(pbVar13->m_aabbMinOrg).m_floats + lVar18 * 4 + lVar23);
            *(undefined1 *)(lVar15 + -2 + lVar18 * 4) =
                 *(undefined1 *)((long)(pbVar13->m_aabbMinOrg).m_floats + lVar18 * 4 + lVar23 + -1);
            *(undefined1 *)(lVar15 + -1 + lVar18 * 4) =
                 *(undefined1 *)((long)(pbVar13->m_aabbMinOrg).m_floats + lVar18 * 4 + lVar23 + -2);
            *(undefined1 *)(lVar15 + lVar18 * 4) =
                 *(undefined1 *)((long)(pbVar13->m_aabbMinOrg).m_floats + lVar18 * 4 + lVar23 + -3);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 4);
          pbVar13 = (this->m_contiguousNodes).m_data;
          lVar15 = uVar14 * 0x40;
          uVar7 = pbVar13[uVar14].m_escapeIndex;
          pvVar17 = (void *)*plVar16;
          *(uint *)((long)pvVar17 + lVar15 + 0x20) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          uVar7 = pbVar13[uVar14].m_subPart;
          *(uint *)((long)pvVar17 + lVar15 + 0x24) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          uVar7 = pbVar13[uVar14].m_triangleIndex;
          *(uint *)((long)pvVar17 + lVar15 + 0x28) =
               uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
          uVar14 = uVar14 + 1;
          lVar12 = lVar12 + 0x40;
          lVar23 = lVar23 + 0x40;
        } while (uVar14 != uVar21);
      }
    }
    else if (0 < (int)uVar11) {
      pbVar13 = (this->m_contiguousNodes).m_data;
      lVar12 = 0;
      do {
        puVar2 = (undefined8 *)((long)(pbVar13->m_aabbMinOrg).m_floats + lVar12);
        uVar10 = puVar2[1];
        *(undefined8 *)((long)pvVar17 + lVar12) = *puVar2;
        ((undefined8 *)((long)pvVar17 + lVar12))[1] = uVar10;
        puVar2 = (undefined8 *)
                 ((long)(((this->m_contiguousNodes).m_data)->m_aabbMaxOrg).m_floats + lVar12);
        uVar10 = puVar2[1];
        puVar3 = (undefined8 *)(*plVar16 + 0x10 + lVar12);
        *puVar3 = *puVar2;
        puVar3[1] = uVar10;
        pbVar13 = (this->m_contiguousNodes).m_data;
        pvVar17 = (void *)*plVar16;
        *(undefined8 *)((long)pvVar17 + lVar12 + 0x20) =
             *(undefined8 *)(pbVar13->m_padding + lVar12 + -0xc);
        *(undefined4 *)((long)pvVar17 + lVar12 + 0x28) =
             *(undefined4 *)(pbVar13->m_padding + lVar12 + -4);
        lVar12 = lVar12 + 0x40;
      } while (uVar21 << 6 != lVar12);
    }
    puVar22 = (undefined4 *)((long)o_alignedDataBuffer + 0x6c);
    puVar20 = (undefined4 *)((long)o_alignedDataBuffer + 0x70);
    lVar12 = (long)(int)uVar11 << 6;
    if (*pcVar19 == '\x01') {
      btAlignedFreeInternal(pvVar17);
    }
  }
  *pcVar19 = '\0';
  *plVar16 = 0;
  *puVar22 = 0;
  *puVar20 = 0;
  lVar23 = (long)pvVar1 + lVar12;
  if ((*(void **)((long)o_alignedDataBuffer + 0xe0) != (void *)0x0) &&
     (*(char *)((long)o_alignedDataBuffer + 0xe8) == '\x01')) {
    btAlignedFreeInternal(*(void **)((long)o_alignedDataBuffer + 0xe0));
  }
  *(long *)((long)o_alignedDataBuffer + 0xe0) = lVar23;
  uVar11 = this->m_subtreeHeaderCount;
  if (i_swapEndian) {
    if (0 < (int)uVar11) {
      pbVar9 = (this->m_SubtreeHeaders).m_data;
      lVar23 = 0;
      do {
        uVar5 = *(ushort *)((long)pbVar9->m_quantizedAabbMin + lVar23);
        *(ushort *)((long)o_alignedDataBuffer + lVar23 + lVar12 + 0xf8) = uVar5 << 8 | uVar5 >> 8;
        uVar5 = *(ushort *)((long)pbVar9->m_quantizedAabbMin + lVar23 + 2);
        *(ushort *)((long)o_alignedDataBuffer + lVar23 + lVar12 + 0xfa) = uVar5 << 8 | uVar5 >> 8;
        uVar5 = *(ushort *)((long)pbVar9->m_quantizedAabbMin + lVar23 + 4);
        *(ushort *)((long)o_alignedDataBuffer + lVar23 + lVar12 + 0xfc) = uVar5 << 8 | uVar5 >> 8;
        uVar5 = *(ushort *)((long)pbVar9->m_quantizedAabbMax + lVar23);
        *(ushort *)((long)o_alignedDataBuffer + lVar23 + lVar12 + 0xfe) = uVar5 << 8 | uVar5 >> 8;
        uVar5 = *(ushort *)((long)pbVar9->m_quantizedAabbMax + lVar23 + 2);
        *(ushort *)((long)o_alignedDataBuffer + lVar23 + lVar12 + 0x100) = uVar5 << 8 | uVar5 >> 8;
        uVar5 = *(ushort *)((long)pbVar9->m_quantizedAabbMax + lVar23 + 4);
        *(ushort *)((long)o_alignedDataBuffer + lVar23 + lVar12 + 0x102) = uVar5 << 8 | uVar5 >> 8;
        uVar7 = *(uint *)((long)pbVar9->m_quantizedAabbMax + lVar23 + 6);
        *(uint *)((long)o_alignedDataBuffer + lVar23 + lVar12 + 0x104) =
             uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        uVar7 = *(uint *)((long)pbVar9->m_padding + lVar23 + -4);
        *(uint *)((long)o_alignedDataBuffer + lVar23 + lVar12 + 0x108) =
             uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        lVar23 = lVar23 + 0x20;
      } while ((ulong)uVar11 << 5 != lVar23);
    }
  }
  else if (0 < (int)uVar11) {
    pbVar9 = (this->m_SubtreeHeaders).m_data;
    lVar12 = 0;
    lVar15 = 0;
    do {
      *(undefined2 *)(lVar23 + lVar12) = *(undefined2 *)((long)pbVar9->m_quantizedAabbMin + lVar12);
      *(undefined2 *)(lVar23 + 2 + lVar12) =
           *(undefined2 *)((long)pbVar9->m_quantizedAabbMin + lVar12 + 2);
      *(undefined2 *)(lVar23 + 4 + lVar12) =
           *(undefined2 *)((long)pbVar9->m_quantizedAabbMin + lVar12 + 4);
      *(undefined2 *)(lVar23 + 6 + lVar12) =
           *(undefined2 *)((long)pbVar9->m_quantizedAabbMax + lVar12);
      *(undefined2 *)(lVar23 + 8 + lVar12) =
           *(undefined2 *)((long)pbVar9->m_quantizedAabbMax + lVar12 + 2);
      *(undefined2 *)(lVar23 + 10 + lVar12) =
           *(undefined2 *)((long)pbVar9->m_quantizedAabbMax + lVar12 + 4);
      *(undefined8 *)(lVar23 + 0xc + lVar12) =
           *(undefined8 *)((long)pbVar9->m_quantizedAabbMax + lVar12 + 6);
      *(undefined8 *)(lVar23 + 0x14 + lVar12) = 0;
      *(undefined4 *)(lVar23 + 0x1c + lVar12) = 0;
      lVar15 = lVar15 + 1;
      lVar12 = lVar12 + 0x20;
    } while (lVar15 < this->m_subtreeHeaderCount);
  }
  *(undefined1 *)((long)o_alignedDataBuffer + 0xe8) = 0;
  *(undefined8 *)((long)o_alignedDataBuffer + 0xe0) = 0;
  *(undefined8 *)((long)o_alignedDataBuffer + 0xd4) = 0;
  *(undefined8 *)o_alignedDataBuffer = 0;
  return true;
}

Assistant:

bool btQuantizedBvh::serialize(void *o_alignedDataBuffer, unsigned /*i_dataBufferSize */, bool i_swapEndian) const
{
	btAssert(m_subtreeHeaderCount == m_SubtreeHeaders.size());
	m_subtreeHeaderCount = m_SubtreeHeaders.size();

/*	if (i_dataBufferSize < calculateSerializeBufferSize() || o_alignedDataBuffer == NULL || (((unsigned)o_alignedDataBuffer & BVH_ALIGNMENT_MASK) != 0))
	{
		///check alignedment for buffer?
		btAssert(0);
		return false;
	}
*/

	btQuantizedBvh *targetBvh = (btQuantizedBvh *)o_alignedDataBuffer;

	// construct the class so the virtual function table, etc will be set up
	// Also, m_leafNodes and m_quantizedLeafNodes will be initialized to default values by the constructor
	new (targetBvh) btQuantizedBvh;

	if (i_swapEndian)
	{
		targetBvh->m_curNodeIndex = static_cast<int>(btSwapEndian(m_curNodeIndex));


		btSwapVector3Endian(m_bvhAabbMin,targetBvh->m_bvhAabbMin);
		btSwapVector3Endian(m_bvhAabbMax,targetBvh->m_bvhAabbMax);
		btSwapVector3Endian(m_bvhQuantization,targetBvh->m_bvhQuantization);

		targetBvh->m_traversalMode = (btTraversalMode)btSwapEndian(m_traversalMode);
		targetBvh->m_subtreeHeaderCount = static_cast<int>(btSwapEndian(m_subtreeHeaderCount));
	}
	else
	{
		targetBvh->m_curNodeIndex = m_curNodeIndex;
		targetBvh->m_bvhAabbMin = m_bvhAabbMin;
		targetBvh->m_bvhAabbMax = m_bvhAabbMax;
		targetBvh->m_bvhQuantization = m_bvhQuantization;
		targetBvh->m_traversalMode = m_traversalMode;
		targetBvh->m_subtreeHeaderCount = m_subtreeHeaderCount;
	}

	targetBvh->m_useQuantization = m_useQuantization;

	unsigned char *nodeData = (unsigned char *)targetBvh;
	nodeData += sizeof(btQuantizedBvh);
	
	unsigned sizeToAdd = 0;//(BVH_ALIGNMENT-((unsigned)nodeData & BVH_ALIGNMENT_MASK))&BVH_ALIGNMENT_MASK;
	nodeData += sizeToAdd;
	
	int nodeCount = m_curNodeIndex;

	if (m_useQuantization)
	{
		targetBvh->m_quantizedContiguousNodes.initializeFromBuffer(nodeData, nodeCount, nodeCount);

		if (i_swapEndian)
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2]);

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1]);
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2] = btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2]);

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex = static_cast<int>(btSwapEndian(m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex));
			}
		}
		else
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
	
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[0];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[1];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMin[2];

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[0];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[1];
				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2] = m_quantizedContiguousNodes[nodeIndex].m_quantizedAabbMax[2];

				targetBvh->m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex = m_quantizedContiguousNodes[nodeIndex].m_escapeIndexOrTriangleIndex;


			}
		}
		nodeData += sizeof(btQuantizedBvhNode) * nodeCount;

		// this clears the pointer in the member variable it doesn't really do anything to the data
		// it does call the destructor on the contained objects, but they are all classes with no destructor defined
		// so the memory (which is not freed) is left alone
		targetBvh->m_quantizedContiguousNodes.initializeFromBuffer(NULL, 0, 0);
	}
	else
	{
		targetBvh->m_contiguousNodes.initializeFromBuffer(nodeData, nodeCount, nodeCount);

		if (i_swapEndian)
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				btSwapVector3Endian(m_contiguousNodes[nodeIndex].m_aabbMinOrg, targetBvh->m_contiguousNodes[nodeIndex].m_aabbMinOrg);
				btSwapVector3Endian(m_contiguousNodes[nodeIndex].m_aabbMaxOrg, targetBvh->m_contiguousNodes[nodeIndex].m_aabbMaxOrg);

				targetBvh->m_contiguousNodes[nodeIndex].m_escapeIndex = static_cast<int>(btSwapEndian(m_contiguousNodes[nodeIndex].m_escapeIndex));
				targetBvh->m_contiguousNodes[nodeIndex].m_subPart = static_cast<int>(btSwapEndian(m_contiguousNodes[nodeIndex].m_subPart));
				targetBvh->m_contiguousNodes[nodeIndex].m_triangleIndex = static_cast<int>(btSwapEndian(m_contiguousNodes[nodeIndex].m_triangleIndex));
			}
		}
		else
		{
			for (int nodeIndex = 0; nodeIndex < nodeCount; nodeIndex++)
			{
				targetBvh->m_contiguousNodes[nodeIndex].m_aabbMinOrg = m_contiguousNodes[nodeIndex].m_aabbMinOrg;
				targetBvh->m_contiguousNodes[nodeIndex].m_aabbMaxOrg = m_contiguousNodes[nodeIndex].m_aabbMaxOrg;

				targetBvh->m_contiguousNodes[nodeIndex].m_escapeIndex = m_contiguousNodes[nodeIndex].m_escapeIndex;
				targetBvh->m_contiguousNodes[nodeIndex].m_subPart = m_contiguousNodes[nodeIndex].m_subPart;
				targetBvh->m_contiguousNodes[nodeIndex].m_triangleIndex = m_contiguousNodes[nodeIndex].m_triangleIndex;
			}
		}
		nodeData += sizeof(btOptimizedBvhNode) * nodeCount;

		// this clears the pointer in the member variable it doesn't really do anything to the data
		// it does call the destructor on the contained objects, but they are all classes with no destructor defined
		// so the memory (which is not freed) is left alone
		targetBvh->m_contiguousNodes.initializeFromBuffer(NULL, 0, 0);
	}

	sizeToAdd = 0;//(BVH_ALIGNMENT-((unsigned)nodeData & BVH_ALIGNMENT_MASK))&BVH_ALIGNMENT_MASK;
	nodeData += sizeToAdd;

	// Now serialize the subtree headers
	targetBvh->m_SubtreeHeaders.initializeFromBuffer(nodeData, m_subtreeHeaderCount, m_subtreeHeaderCount);
	if (i_swapEndian)
	{
		for (int i = 0; i < m_subtreeHeaderCount; i++)
		{
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[0] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[1] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[2] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMin[2]);

			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[0] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[1] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[2] = btSwapEndian(m_SubtreeHeaders[i].m_quantizedAabbMax[2]);

			targetBvh->m_SubtreeHeaders[i].m_rootNodeIndex = static_cast<int>(btSwapEndian(m_SubtreeHeaders[i].m_rootNodeIndex));
			targetBvh->m_SubtreeHeaders[i].m_subtreeSize = static_cast<int>(btSwapEndian(m_SubtreeHeaders[i].m_subtreeSize));
		}
	}
	else
	{
		for (int i = 0; i < m_subtreeHeaderCount; i++)
		{
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[0] = (m_SubtreeHeaders[i].m_quantizedAabbMin[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[1] = (m_SubtreeHeaders[i].m_quantizedAabbMin[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMin[2] = (m_SubtreeHeaders[i].m_quantizedAabbMin[2]);

			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[0] = (m_SubtreeHeaders[i].m_quantizedAabbMax[0]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[1] = (m_SubtreeHeaders[i].m_quantizedAabbMax[1]);
			targetBvh->m_SubtreeHeaders[i].m_quantizedAabbMax[2] = (m_SubtreeHeaders[i].m_quantizedAabbMax[2]);

			targetBvh->m_SubtreeHeaders[i].m_rootNodeIndex = (m_SubtreeHeaders[i].m_rootNodeIndex);
			targetBvh->m_SubtreeHeaders[i].m_subtreeSize = (m_SubtreeHeaders[i].m_subtreeSize);

			// need to clear padding in destination buffer
			targetBvh->m_SubtreeHeaders[i].m_padding[0] = 0;
			targetBvh->m_SubtreeHeaders[i].m_padding[1] = 0;
			targetBvh->m_SubtreeHeaders[i].m_padding[2] = 0;
		}
	}
	nodeData += sizeof(btBvhSubtreeInfo) * m_subtreeHeaderCount;

	// this clears the pointer in the member variable it doesn't really do anything to the data
	// it does call the destructor on the contained objects, but they are all classes with no destructor defined
	// so the memory (which is not freed) is left alone
	targetBvh->m_SubtreeHeaders.initializeFromBuffer(NULL, 0, 0);

	// this wipes the virtual function table pointer at the start of the buffer for the class
	*((void**)o_alignedDataBuffer) = NULL;

	return true;
}